

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall c4::yml::Parser::LineContents::current_col(LineContents *this,csubstr s)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  char *pcVar5;
  
  pcVar5 = s.str;
  if (pcVar5 < (this->full).str) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        sVar4 = (*pcVar2)();
        return sVar4;
      }
    }
    (*(code *)PTR_error_impl_002a27a8)
              ("check failed: s.str >= full.str",0x1f,(anonymous_namespace)::s_default_callbacks);
  }
  sVar4 = (this->full).len;
  if (sVar4 == 0) {
    if (s.len == 0) {
      pcVar1 = (this->full).str;
      bVar3 = pcVar1 != (char *)0x0 && pcVar1 == pcVar5;
      goto LAB_0023b136;
    }
  }
  else {
    pcVar1 = (this->full).str;
    bVar3 = pcVar5 + s.len <= pcVar1 + sVar4 && pcVar1 <= pcVar5;
LAB_0023b136:
    if (bVar3) goto LAB_0023b1ad;
  }
  if ((s_error_flags & 1) != 0) {
    bVar3 = is_debugger_attached();
    if (bVar3) {
      pcVar2 = (code *)swi(3);
      sVar4 = (*pcVar2)();
      return sVar4;
    }
  }
  (*(code *)PTR_error_impl_002a27a8)
            ("check failed: full.is_super(s)",0x1e,(anonymous_namespace)::s_default_callbacks);
LAB_0023b1ad:
  return (long)pcVar5 - (long)(this->full).str;
}

Assistant:

size_t current_col(csubstr s) const
        {
            RYML_ASSERT(s.str >= full.str);
            RYML_ASSERT(full.is_super(s));
            size_t col = static_cast<size_t>(s.str - full.str);
            return col;
        }